

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

char * imm_bit_name(long *imm_flags)

{
  char *pcVar1;
  size_t sVar2;
  
  imm_bit_name::buf[0] = '\0';
  if ((*imm_flags & 1) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," summon",8);
  }
  if ((*imm_flags & 2) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," cha",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"arm",4);
  }
  if ((*imm_flags & 4) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," mag",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"gic",4);
  }
  if ((*imm_flags & 8) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," weapon",8);
  }
  if ((*imm_flags & 0x10) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," blu",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"unt",4);
  }
  if ((*imm_flags & 0x20) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," piercin",8);
    (imm_bit_name::buf + sVar2 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*imm_flags & 0x40) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," slashin",8);
    (imm_bit_name::buf + sVar2 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*imm_flags & 0x80) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," fir",4);
    (imm_bit_name::buf + sVar2 + 4)[0] = 'e';
    (imm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*imm_flags & 0x100) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," col",4);
    (imm_bit_name::buf + sVar2 + 4)[0] = 'd';
    (imm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*imm_flags & 0x200) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," lightni",8);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 7,"ing",4);
  }
  if ((*imm_flags & 0x400) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," aci",4);
    (imm_bit_name::buf + sVar2 + 4)[0] = 'd';
    (imm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*imm_flags & 0x800) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," poison",8);
  }
  if ((*imm_flags & 0x1000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," negativ",8);
    (imm_bit_name::buf + sVar2 + 8)[0] = 'e';
    (imm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*imm_flags & 0x2000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," hol",4);
    (imm_bit_name::buf + sVar2 + 4)[0] = 'y';
    (imm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*imm_flags & 0x4000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," energy",8);
  }
  if ((*imm_flags & 0x8000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," mental",8);
  }
  if ((*imm_flags & 0x10000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," disease",8);
    imm_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*imm_flags & 0x20000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," drownin",8);
    (imm_bit_name::buf + sVar2 + 8)[0] = 'g';
    (imm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*imm_flags & 0x40000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," lig",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"ght",4);
  }
  if ((*imm_flags & 0x2000000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," iro",4);
    (imm_bit_name::buf + sVar2 + 4)[0] = 'n';
    (imm_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*imm_flags & 0x800000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," mithril",8);
    imm_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*imm_flags & 0x1000000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," silver",8);
  }
  if ((*imm_flags & 0x4000000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," sle",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"eep",4);
  }
  if ((*imm_flags & 0x80000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," sou",4);
    builtin_strncpy(imm_bit_name::buf + sVar2 + 3,"und",4);
  }
  if ((*imm_flags & 0x100000) != 0) {
    sVar2 = strlen(imm_bit_name::buf);
    builtin_strncpy(imm_bit_name::buf + sVar2," interna",8);
    (imm_bit_name::buf + sVar2 + 8)[0] = 'l';
    (imm_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  pcVar1 = imm_bit_name::buf;
  if (imm_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *imm_bit_name(long imm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(imm_flags, IMM_SUMMON))
		strcat(buf, " summon");

	if (IS_SET(imm_flags, IMM_CHARM))
		strcat(buf, " charm");

	if (IS_SET(imm_flags, IMM_MAGIC))
		strcat(buf, " magic");

	if (IS_SET(imm_flags, IMM_WEAPON))
		strcat(buf, " weapon");

	if (IS_SET(imm_flags, IMM_BASH))
		strcat(buf, " blunt");

	if (IS_SET(imm_flags, IMM_PIERCE))
		strcat(buf, " piercing");

	if (IS_SET(imm_flags, IMM_SLASH))
		strcat(buf, " slashing");

	if (IS_SET(imm_flags, IMM_FIRE))
		strcat(buf, " fire");

	if (IS_SET(imm_flags, IMM_COLD))
		strcat(buf, " cold");

	if (IS_SET(imm_flags, IMM_LIGHTNING))
		strcat(buf, " lightning");

	if (IS_SET(imm_flags, IMM_ACID))
		strcat(buf, " acid");

	if (IS_SET(imm_flags, IMM_POISON))
		strcat(buf, " poison");

	if (IS_SET(imm_flags, IMM_NEGATIVE))
		strcat(buf, " negative");

	if (IS_SET(imm_flags, IMM_HOLY))
		strcat(buf, " holy");

	if (IS_SET(imm_flags, IMM_ENERGY))
		strcat(buf, " energy");

	if (IS_SET(imm_flags, IMM_MENTAL))
		strcat(buf, " mental");

	if (IS_SET(imm_flags, IMM_DISEASE))
		strcat(buf, " disease");

	if (IS_SET(imm_flags, IMM_DROWNING))
		strcat(buf, " drowning");

	if (IS_SET(imm_flags, IMM_LIGHT))
		strcat(buf, " light");

	if (IS_SET(imm_flags, IMM_IRON))
		strcat(buf, " iron");

	if (IS_SET(imm_flags, IMM_MITHRIL))
		strcat(buf, " mithril");

	if (IS_SET(imm_flags, IMM_SILVER))
		strcat(buf, " silver");

	if (IS_SET(imm_flags, IMM_SLEEP))
		strcat(buf, " sleep");

	if (IS_SET(imm_flags, IMM_SOUND))
		strcat(buf, " sound");

	if (IS_SET(imm_flags, IMM_INTERNAL))

		strcat(buf, " internal");
	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}